

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkBddDec(Abc_Ntk_t *pNtk,int fVerbose)

{
  DdNode **pbVars;
  int iVar1;
  int iVar2;
  DdManager *dd_00;
  Abc_Obj_t *pObj;
  reo_man *p;
  DdNode *pDVar3;
  int local_85c;
  int i;
  Abc_Obj_t *pNode;
  DdNode *bFunc;
  DdNode *pFuncs [256];
  DdManager *dd;
  reo_man *pReo;
  Abc_Ntk_t *pNtkNew;
  int fReorder;
  int fDropInternal;
  int nBddSizeMax;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x3f3,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
  }
  iVar1 = Abc_NtkCoNum(pNtk);
  if (0x100 < iVar1) {
    __assert_fail("Abc_NtkCoNum(pNtk) <= BDD_FUNC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x3f4,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
  }
  dd_00 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,1000000,0,1,fVerbose);
  if (dd_00 == (DdManager *)0x0) {
    Abc_Print(-1,"Construction of global BDDs has failed.\n");
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    for (local_85c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_85c < iVar1; local_85c = local_85c + 1) {
      pObj = Abc_NtkCo(pNtk,local_85c);
      pDVar3 = (DdNode *)Abc_ObjGlobalBdd(pObj);
      pFuncs[(long)local_85c + -1] = pDVar3;
    }
    iVar1 = dd_00->size;
    iVar2 = Abc_NtkCiNum(pNtk);
    if (iVar1 != iVar2) {
      __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                    ,0x400,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
    }
    for (local_85c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_85c < iVar1; local_85c = local_85c + 1) {
      Cudd_addNewVarAtLevel(dd_00,dd_00->size);
    }
    iVar1 = Abc_NtkCiNum(pNtk);
    p = Extra_ReorderInit(iVar1,1000);
    Extra_ReorderSetMinimizationType(p,REO_MINIMIZE_WIDTH);
    Extra_ReorderSetVerification(p,1);
    Extra_ReorderSetVerbosity(p,1);
    iVar1 = Abc_NtkCiNum(pNtk);
    iVar2 = Abc_NtkCoNum(pNtk);
    pDVar3 = Abc_NtkBddDecInt(p,dd_00,&bFunc,iVar1,iVar2);
    Cudd_Ref(pDVar3);
    Extra_ReorderQuit(p);
    pbVars = dd_00->vars;
    iVar1 = Abc_NtkCiNum(pNtk);
    Abc_NtkExploreCofs(dd_00,pDVar3,pbVars,iVar1,6);
    pNtk_local = Abc_NtkDup(pNtk);
    Cudd_RecursiveDeref(dd_00,pDVar3);
    Abc_NtkFreeGlobalBdds(pNtk,1);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkBddDec( Abc_Ntk_t * pNtk, int fVerbose )
{
    int nBddSizeMax   = 1000000;
    int fDropInternal =       0;
    int fReorder      =       1;
    Abc_Ntk_t * pNtkNew;
    reo_man * pReo;
    DdManager * dd;
    DdNode * pFuncs[BDD_FUNC_MAX];
    DdNode * bFunc;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkCoNum(pNtk) <= BDD_FUNC_MAX );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, nBddSizeMax, fDropInternal, fReorder, fVerbose );
    if ( dd == NULL )
    {
        Abc_Print( -1, "Construction of global BDDs has failed.\n" );
        return NULL;
    }
    // collect global BDDs
    Abc_NtkForEachCo( pNtk, pNode, i )
        pFuncs[i] = (DdNode *)Abc_ObjGlobalBdd(pNode);

    // create new variables at the bottom
    assert( dd->size == Abc_NtkCiNum(pNtk) );
    for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
        Cudd_addNewVarAtLevel( dd, dd->size );

    // prepare reordering engine
    pReo = Extra_ReorderInit( Abc_NtkCiNum(pNtk), 1000 );
    Extra_ReorderSetMinimizationType( pReo, REO_MINIMIZE_WIDTH );
    Extra_ReorderSetVerification( pReo, 1 );
    Extra_ReorderSetVerbosity( pReo, 1 );

    // derive characteristic function
    bFunc = Abc_NtkBddDecInt( pReo, dd, pFuncs, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk) );  Cudd_Ref( bFunc );
    Extra_ReorderQuit( pReo );

Abc_NtkExploreCofs( dd, bFunc, dd->vars, Abc_NtkCiNum(pNtk), 6 );

    // create new network
//    pNtkNew = Abc_NtkCreateFromCharFunc( pNtk, dd, bFunc );
    pNtkNew = Abc_NtkDup( pNtk );

    // cleanup
    Cudd_RecursiveDeref( dd, bFunc );
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    return pNtkNew;
}